

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O3

void __thiscall hwnet::TCPSocket::registerTimer(TCPSocket *this,int tt)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _Atomic_word _Var4;
  int iVar5;
  rep rVar6;
  bool bVar7;
  undefined1 local_48 [24];
  shared_ptr<hwnet::TCPSocket> sp;
  
  if (tt == 1) {
    if (this->ptrSendlist->head == (sendContext *)0x0) {
      return;
    }
    p_Var2 = (this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      _Var4 = p_Var2->_M_use_count;
      do {
        if (_Var4 == 0) goto LAB_0011657a;
        LOCK();
        iVar5 = p_Var2->_M_use_count;
        bVar7 = _Var4 == iVar5;
        if (bVar7) {
          p_Var2->_M_use_count = _Var4 + 1;
          iVar5 = _Var4;
        }
        _Var4 = iVar5;
        UNLOCK();
      } while (!bVar7);
      iVar5 = p_Var2->_M_use_count;
      peVar3 = (this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      if ((iVar5 != 0) && (peVar3 != (element_type *)0x0)) {
        return;
      }
    }
LAB_0011657a:
    std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::TCPSocket,void>
              ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x10),
               (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<hwnet::TCPSocket>);
    rVar6 = std::chrono::_V2::steady_clock::now();
    (this->lastSendTime).__d.__r = rVar6;
    util::TimerRoutine::
    addTimer<void(&)(std::shared_ptr<hwnet::util::Timer>const&,std::shared_ptr<hwnet::TCPSocket>),std::shared_ptr<hwnet::TCPSocket>&>
              ((TimerRoutine *)local_48,(milliseconds)&this->poller_->timerRoutine,
               (_func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPSocket> *)
               (long)timoutResolution,(shared_ptr<hwnet::TCPSocket> *)onTimer);
  }
  else {
    if ((this->recvList).
        super__List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>
        ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&this->recvList) {
      return;
    }
    p_Var2 = (this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      _Var4 = p_Var2->_M_use_count;
      do {
        if (_Var4 == 0) goto LAB_00116613;
        LOCK();
        iVar5 = p_Var2->_M_use_count;
        bVar7 = _Var4 == iVar5;
        if (bVar7) {
          p_Var2->_M_use_count = _Var4 + 1;
          iVar5 = _Var4;
        }
        _Var4 = iVar5;
        UNLOCK();
      } while (!bVar7);
      iVar5 = p_Var2->_M_use_count;
      peVar3 = (this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      if ((iVar5 != 0) && (peVar3 != (element_type *)0x0)) {
        return;
      }
    }
LAB_00116613:
    std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::TCPSocket,void>
              ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x10),
               (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<hwnet::TCPSocket>);
    rVar6 = std::chrono::_V2::steady_clock::now();
    (this->lastRecvTime).__d.__r = rVar6;
    util::TimerRoutine::
    addTimer<void(&)(std::shared_ptr<hwnet::util::Timer>const&,std::shared_ptr<hwnet::TCPSocket>),std::shared_ptr<hwnet::TCPSocket>&>
              ((TimerRoutine *)local_48,(milliseconds)&this->poller_->timerRoutine,
               (_func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPSocket> *)
               (long)timoutResolution,(shared_ptr<hwnet::TCPSocket> *)onTimer);
  }
  std::__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>,
             (__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)local_48);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)(local_48._8_8_ + 0xc);
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = *(_Atomic_word *)(local_48._8_8_ + 0xc);
      *(int *)(local_48._8_8_ + 0xc) = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*(*(_func_int ***)local_48._8_8_)[3])();
    }
  }
  if (sp.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               sp.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void TCPSocket::registerTimer(int tt) {
	if(tt == timerSend) {
		//send
		if(!this->ptrSendlist->empty() && !this->timer.lock()) {
			auto sp = shared_from_this();
			this->lastSendTime = std::chrono::steady_clock::now();
			this->timer = this->poller_->addTimer(timoutResolution,TCPSocket::onTimer,sp);
		}

	} else {
		//recv
		if(!this->recvListEmpty() && !this->timer.lock()) {	
			auto sp = shared_from_this();
			this->lastRecvTime = std::chrono::steady_clock::now();
			this->timer = this->poller_->addTimer(timoutResolution,TCPSocket::onTimer,sp);
		}
	}
}